

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

void __thiscall iDynTree::optimalcontrol::integrators::Integrator::Integrator(Integrator *this)

{
  IntegratorInfoData *this_00;
  __shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_001d3978;
  this->m_dTmax = 0.0;
  (this->m_dynamicalSystem_ptr).
  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_dynamicalSystem_ptr).
  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_solution).
  super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_solution).
  super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_solution).
  super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (IntegratorInfoData *)operator_new(0x30);
  IntegratorInfoData::IntegratorInfoData(this_00);
  std::
  __shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,void>
            ((__shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,(__gnu_cxx::_Lock_policy)2>
              *)&this->m_infoData,this_00);
  std::
  __shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_30,
                 &(this->m_infoData).
                  super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
                );
  IntegratorInfo::IntegratorInfo
            (&this->m_info,
             (shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

Integrator::Integrator()
            : m_dTmax(0)
            , m_dynamicalSystem_ptr(nullptr)
            , m_infoData(new IntegratorInfoData)
            , m_info(m_infoData)
            {
            }